

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O3

bool __thiscall adios2::core::IO::RemoveVariable(IO *this,string *name)

{
  int iVar1;
  iterator __it;
  ScopedTimer __var2349;
  ScopedTimer local_18;
  
  if (RemoveVariable(std::__cxx11::string_const&)::__var349 == '\0') {
    iVar1 = __cxa_guard_acquire(&RemoveVariable(std::__cxx11::string_const&)::__var349);
    if (iVar1 != 0) {
      RemoveVariable::__var349 = (void *)ps_timer_create_("IO::RemoveVariable");
      __cxa_guard_release(&RemoveVariable(std::__cxx11::string_const&)::__var349);
    }
  }
  local_18.m_timer = RemoveVariable::__var349;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  __it = std::
         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         ::find(&(this->m_Variables)._M_h,name);
  if (__it.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::erase(&(this->m_Variables)._M_h,
            (const_iterator)
            __it.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_true>
            ._M_cur);
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_18);
  return __it.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_true>
         ._M_cur != (__node_type *)0x0;
}

Assistant:

bool IO::RemoveVariable(const std::string &name) noexcept
{
    PERFSTUBS_SCOPED_TIMER("IO::RemoveVariable");
    bool isRemoved = false;
    auto itVariable = m_Variables.find(name);
    // variable exists
    if (itVariable != m_Variables.end())
    {
        m_Variables.erase(itVariable);
        isRemoved = true;
    }
    return isRemoved;
}